

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase45.cpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase45<std::complex<float>_>::apply
          (Phase45<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  complex<float> *vector_00;
  anon_class_16_2_357f297d aVar2;
  undefined1 local_38 [8];
  anon_class_16_2_357f297d f;
  int qubit;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  Phase45<std::complex<float>_> *this_local;
  
  f.lambda._M_value._4_4_ = offset;
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  f.lambda._M_value._0_4_ = iVar1 + f.lambda._M_value._4_4_;
  vector_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  aVar2 = lambda_Phase45<std::complex<float>>(op,vector_00);
  local_38 = (undefined1  [8])aVar2.vector;
  apply2b<qclab::qgates::lambda_Phase45<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,(int)f.lambda._M_value,(anon_class_16_2_357f297d *)local_38);
  return;
}

Assistant:

void Phase45< T >::apply( Op op , const int nbQubits ,
                            std::vector< T >& vector ,
                            const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_Phase45( op , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }